

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_callWithObjectParameterEqualComparisonButFailsWithoutComparator_TestShell::
~TEST_MockExpectedCall_callWithObjectParameterEqualComparisonButFailsWithoutComparator_TestShell
          (TEST_MockExpectedCall_callWithObjectParameterEqualComparisonButFailsWithoutComparator_TestShell
           *this)

{
  TEST_MockExpectedCall_callWithObjectParameterEqualComparisonButFailsWithoutComparator_TestShell
  *this_local;
  
  ~TEST_MockExpectedCall_callWithObjectParameterEqualComparisonButFailsWithoutComparator_TestShell
            (this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithObjectParameterEqualComparisonButFailsWithoutComparator)
{
    MockNamedValueComparatorsAndCopiersRepository repository;
    MockNamedValue::setDefaultComparatorsAndCopiersRepository(&repository);

    TypeForTestingExpectedFunctionCall type(1), equalType(1);
    MockNamedValue parameter("name");
    parameter.setConstObjectPointer("type", &equalType);
    call->withParameterOfType("type", "name", &type);
    CHECK(!call->hasInputParameter(parameter));
}